

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dll.c
# Opt level: O3

nsync_dll_list_ nsync_dll_make_first_in_list_(nsync_dll_list_ list,nsync_dll_element_ *e)

{
  nsync_dll_element_s_ *pnVar1;
  nsync_dll_element_s_ *pnVar2;
  
  if (e != (nsync_dll_element_ *)0x0) {
    if (list != (nsync_dll_list_)0x0) {
      pnVar1 = list->next;
      pnVar2 = e->prev;
      list->next = e;
      e->prev = list;
      pnVar2->next = pnVar1;
      pnVar1->prev = pnVar2;
      return list;
    }
    list = e->prev;
  }
  return list;
}

Assistant:

nsync_dll_list_ nsync_dll_make_first_in_list_ (nsync_dll_list_ list, nsync_dll_element_ *e) {
	if (e != NULL) {
		if (list == NULL) {
			list = e->prev;   /*e->prev is e_last*/
		} else {
			nsync_dll_splice_after_ (list, e);
		}
	}
	return (list);
}